

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

cl_int clReleaseSemaphoreKHR(cl_semaphore_khr semaphore)

{
  atomic<unsigned_long> *paVar1;
  ulong enqueueCounter;
  CLIntercept *this;
  byte bVar2;
  cl_uint cVar3;
  cl_int errorCode;
  CLdispatchX *pCVar4;
  time_point end;
  undefined8 in_stack_ffffffffffffff98;
  cl_semaphore_khr p_Var5;
  undefined4 uVar6;
  allocator local_59;
  time_point local_58;
  string local_50;
  
  this = g_pIntercept;
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x476;
  }
  pCVar4 = CLIntercept::dispatchX(g_pIntercept,semaphore);
  if (pCVar4->clReleaseSemaphoreKHR == (_func_cl_int_cl_semaphore_khr *)0x0) {
    return -0x476;
  }
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  bVar2 = (this->m_Config).CallLogging;
  cVar3 = 0;
  if ((bool)bVar2 == true) {
    cVar3 = CLIntercept::getRefCount(this,semaphore);
    bVar2 = (this->m_Config).CallLogging;
  }
  if ((bVar2 & 1) != 0) {
    p_Var5 = semaphore;
    CLIntercept::callLoggingEnter
              (this,"clReleaseSemaphoreKHR",enqueueCounter,(cl_kernel)0x0,
               "[ ref count = %d ] semaphore = %p",(ulong)cVar3,semaphore);
    uVar6 = (undefined4)((ulong)p_Var5 >> 0x20);
  }
  CLIntercept::checkRemoveSemaphoreInfo(this,semaphore);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_58.__d.__r = (duration)0;
  }
  else {
    local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode = (*pCVar4->clReleaseSemaphoreKHR)(semaphore);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_50,"",&local_59);
      CLIntercept::updateHostTimingStats(this,"clReleaseSemaphoreKHR",&local_50,local_58,end);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((bool)bVar2 == false) {
      if ((errorCode == 0) || ((this->m_Config).NoErrors == false)) goto LAB_00125703;
    }
    else if (errorCode == 0) goto LAB_001256da;
  }
  else {
    if (errorCode == 0) {
LAB_001256da:
      errorCode = 0;
      goto LAB_00125703;
    }
    CLIntercept::logError(this,"clReleaseSemaphoreKHR",errorCode);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors != false) {
    errorCode = 0;
  }
LAB_00125703:
  if ((semaphore != (cl_semaphore_khr)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    paVar1 = &(this->m_ObjectTracker).m_Semaphores.NumReleases;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clReleaseSemaphoreKHR",errorCode,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "[ ref count = %d ]",CONCAT44(uVar6,cVar3 - 1));
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_50,"",&local_59);
    CLIntercept::chromeCallLoggingExit(this,"clReleaseSemaphoreKHR",&local_50,false,0,local_58,end);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return errorCode;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clReleaseSemaphoreKHR(
    cl_semaphore_khr semaphore)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(semaphore);
        if( dispatchX.clReleaseSemaphoreKHR )
        {
            GET_ENQUEUE_COUNTER();

            cl_uint ref_count =
                pIntercept->config().CallLogging ?
                pIntercept->getRefCount( semaphore ) : 0;
            CALL_LOGGING_ENTER( "[ ref count = %d ] semaphore = %p",
                ref_count,
                semaphore );
            pIntercept->checkRemoveSemaphoreInfo( semaphore );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clReleaseSemaphoreKHR(
                semaphore );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            ADD_OBJECT_RELEASE( semaphore );
            CALL_LOGGING_EXIT( retVal, "[ ref count = %d ]", --ref_count );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_SEMAPHORE_KHR);
}